

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

LZ4_streamHC_t * LZ4_initStreamHC(void *buffer,size_t size)

{
  int iVar1;
  size_t alignment;
  LZ4HC_CCtx_internal *hcstate;
  LZ4_streamHC_t *LZ4_streamHCPtr;
  size_t size_local;
  void *buffer_local;
  
  if (buffer == (void *)0x0) {
    buffer_local = (void *)0x0;
  }
  else if (size < 0x40038) {
    buffer_local = (void *)0x0;
  }
  else {
    alignment = LZ4_streamHC_t_alignment();
    iVar1 = LZ4_isAligned(buffer,alignment);
    if (iVar1 == 0) {
      buffer_local = (void *)0x0;
    }
    else {
      memset(buffer,0,0x40030);
      LZ4_setCompressionLevel((LZ4_streamHC_t *)buffer,9);
      buffer_local = buffer;
    }
  }
  return (LZ4_streamHC_t *)buffer_local;
}

Assistant:

LZ4_streamHC_t* LZ4_initStreamHC (void* buffer, size_t size)
{
    LZ4_streamHC_t* const LZ4_streamHCPtr = (LZ4_streamHC_t*)buffer;
    /* if compilation fails here, LZ4_STREAMHCSIZE must be increased */
    LZ4_STATIC_ASSERT(sizeof(LZ4HC_CCtx_internal) <= LZ4_STREAMHCSIZE);
    DEBUGLOG(4, "LZ4_initStreamHC(%p, %u)", buffer, (unsigned)size);
    /* check conditions */
    if (buffer == NULL) return NULL;
    if (size < sizeof(LZ4_streamHC_t)) return NULL;
    if (!LZ4_isAligned(buffer, LZ4_streamHC_t_alignment())) return NULL;
    /* init */
    { LZ4HC_CCtx_internal* const hcstate = &(LZ4_streamHCPtr->internal_donotuse);
      MEM_INIT(hcstate, 0, sizeof(*hcstate)); }
    LZ4_setCompressionLevel(LZ4_streamHCPtr, LZ4HC_CLEVEL_DEFAULT);
    return LZ4_streamHCPtr;
}